

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_scan_sse41_128_32.c
# Opt level: O2

parasail_result_t *
parasail_nw_stats_table_scan_profile_sse41_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int *piVar1;
  uint *puVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  void *pvVar5;
  void *pvVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  uint uVar27;
  int iVar28;
  uint uVar29;
  int iVar30;
  uint uVar31;
  parasail_result_t *ppVar32;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *ptr;
  __m128i *b_03;
  __m128i *b_04;
  __m128i *b_05;
  __m128i *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  __m128i *ptr_04;
  __m128i *ptr_05;
  int32_t *ptr_06;
  uint uVar33;
  undefined4 in_register_0000000c;
  undefined8 uVar34;
  size_t len;
  ulong uVar35;
  __m128i *palVar36;
  char *pcVar37;
  undefined8 extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  uint uVar38;
  int iVar39;
  ulong size;
  ulong uVar40;
  long lVar41;
  char *__format;
  long lVar42;
  int32_t iVar43;
  __m128i *palVar44;
  int32_t t;
  int iVar45;
  ulong uVar46;
  bool bVar47;
  bool bVar48;
  ulong uVar49;
  undefined1 auVar50 [16];
  undefined1 extraout_XMM0 [16];
  __m128i alVar51;
  __m128i alVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  __m128i alVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  __m128i alVar64;
  int iVar65;
  uint uVar66;
  int iVar72;
  int iVar74;
  int iVar78;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  uint uVar73;
  int iVar75;
  uint uVar76;
  int iVar79;
  uint uVar80;
  undefined1 auVar70 [16];
  long lVar77;
  __m128i alVar71;
  uint uVar83;
  uint uVar84;
  uint uVar86;
  undefined1 auVar81 [16];
  long lVar85;
  __m128i alVar82;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  uint uVar97;
  int iVar98;
  uint uVar99;
  int iVar100;
  uint uVar101;
  int iVar102;
  uint uVar103;
  int iVar104;
  int iVar105;
  int iVar107;
  int iVar108;
  int iVar109;
  undefined1 auVar106 [16];
  int iVar110;
  int iVar111;
  int iVar112;
  int iVar113;
  undefined1 auVar114 [16];
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i vH;
  __m128i vH_00;
  __m128i vH_01;
  __m128i vH_02;
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  uint local_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint local_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint local_148;
  uint uStack_144;
  uint uStack_140;
  uint uStack_13c;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  __m128i_32_t h;
  
  uVar34 = CONCAT44(in_register_0000000c,open);
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar37 = "profile";
  }
  else {
    pvVar3 = (profile->profile32).score;
    if (pvVar3 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar37 = "profile->profile32.score";
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar37 = "profile->matrix";
      }
      else {
        uVar33 = profile->s1Len;
        if ((int)uVar33 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar37 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar37 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar37 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar37 = "open";
        }
        else {
          if (-1 < gap) {
            uVar38 = uVar33 - 1;
            size = (ulong)uVar33 + 3 >> 2;
            uVar49 = (ulong)uVar38 % size;
            iVar45 = -open;
            iVar65 = ppVar4->min;
            uVar29 = 0x80000000 - iVar65;
            if (iVar65 != iVar45 && SBORROW4(iVar65,iVar45) == iVar65 + open < 0) {
              uVar29 = open | 0x80000000;
            }
            pvVar5 = (profile->profile32).matches;
            uVar27 = 0x7ffffffe - ppVar4->max;
            local_1d8._0_4_ = uVar27;
            pvVar6 = (profile->profile32).similar;
            ppVar32 = parasail_result_new_table3((uint)((ulong)uVar33 + 3) & 0x7ffffffc,s2Len);
            if (ppVar32 != (parasail_result_t *)0x0) {
              local_1e8._0_4_ = gap;
              ppVar32->flag = ppVar32->flag | 0x4430401;
              b = parasail_memalign___m128i(0x10,size);
              b_00 = parasail_memalign___m128i(0x10,size);
              b_01 = parasail_memalign___m128i(0x10,size);
              b_02 = parasail_memalign___m128i(0x10,size);
              ptr = parasail_memalign___m128i(0x10,size);
              b_03 = parasail_memalign___m128i(0x10,size);
              b_04 = parasail_memalign___m128i(0x10,size);
              b_05 = parasail_memalign___m128i(0x10,size);
              ptr_00 = parasail_memalign___m128i(0x10,size);
              ptr_01 = parasail_memalign___m128i(0x10,size);
              ptr_02 = parasail_memalign___m128i(0x10,size);
              ptr_03 = parasail_memalign___m128i(0x10,size);
              ptr_04 = parasail_memalign___m128i(0x10,size);
              ptr_05 = parasail_memalign___m128i(0x10,size);
              uVar40 = CONCAT44(0,s2Len + 1);
              local_1f8._8_8_ = local_1f8._0_8_;
              local_1f8._0_8_ = uVar40;
              ptr_06 = parasail_memalign_int32_t(0x10,uVar40);
              bVar48 = ptr_00 == (__m128i *)0x0;
              alVar51[1]._1_7_ = (undefined7)((ulong)extraout_RDX >> 8);
              alVar51[1]._0_1_ = bVar48;
              auVar50._0_8_ = -(ulong)(b == (__m128i *)0x0);
              auVar50._8_8_ = -(ulong)(b_00 == (__m128i *)0x0);
              auVar87._0_8_ = -(ulong)(b_01 == (__m128i *)0x0);
              auVar87._8_8_ = -(ulong)(b_02 == (__m128i *)0x0);
              auVar50 = packssdw(auVar50,auVar87);
              auVar60._0_8_ = -(ulong)(ptr == (__m128i *)0x0);
              auVar60._8_8_ = -(ulong)(b_03 == (__m128i *)0x0);
              auVar61._0_8_ = -(ulong)(b_04 == (__m128i *)0x0);
              auVar61._8_8_ = -(ulong)(b_05 == (__m128i *)0x0);
              auVar60 = packssdw(auVar60,auVar61);
              auVar50 = packssdw(auVar50,auVar60);
              bVar20 = (auVar50 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
              bVar21 = (auVar50 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0;
              bVar19 = (auVar50 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
              bVar18 = (auVar50 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
              bVar17 = (auVar50 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
              bVar16 = (auVar50 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
              bVar15 = (auVar50 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
              bVar14 = (auVar50 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
              bVar13 = (auVar50 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
              bVar12 = (auVar50 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
              bVar11 = (auVar50 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
              bVar10 = (auVar50 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
              bVar9 = (auVar50 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
              bVar8 = (auVar50 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
              bVar7 = (auVar50 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
              bVar47 = auVar50[0xf] < '\0';
              len = CONCAT71((int7)((ulong)uVar34 >> 8),
                             ((((ptr_04 == (__m128i *)0x0 || ptr_03 == (__m128i *)0x0) ||
                               ptr_05 == (__m128i *)0x0) ||
                              ((ptr_01 == (__m128i *)0x0 || bVar48) || ptr_02 == (__m128i *)0x0)) ||
                             ptr_06 == (int32_t *)0x0) ||
                             (((((((((((((((bVar20 || bVar21) || bVar19) || bVar18) || bVar17) ||
                                       bVar16) || bVar15) || bVar14) || bVar13) || bVar12) || bVar11
                                  ) || bVar10) || bVar9) || bVar8) || bVar7) || bVar47));
              if (((((ptr_04 != (__m128i *)0x0 && ptr_03 != (__m128i *)0x0) &&
                    ptr_05 != (__m128i *)0x0) &&
                   ((ptr_01 != (__m128i *)0x0 && !bVar48) && ptr_02 != (__m128i *)0x0)) &&
                  ptr_06 != (int32_t *)0x0) &&
                  (((((((((((((((!bVar20 && !bVar21) && !bVar19) && !bVar18) && !bVar17) && !bVar16)
                           && !bVar15) && !bVar14) && !bVar13) && !bVar12) && !bVar11) && !bVar10)
                     && !bVar9) && !bVar8) && !bVar7) && !bVar47)) {
                iVar28 = s2Len + -1;
                uVar29 = uVar29 + 1;
                iVar39 = (int)size;
                iVar30 = -(iVar39 * gap);
                alVar51[0] = size;
                parasail_memset___m128i(b_03,alVar51,len);
                c[1] = extraout_RDX_00;
                c[0] = size;
                parasail_memset___m128i(b_04,c,len);
                c_00[1] = extraout_RDX_01;
                c_00[0] = size;
                parasail_memset___m128i(b_05,c_00,len);
                c_01[1] = extraout_RDX_02;
                c_01[0] = size;
                parasail_memset___m128i(b,c_01,len);
                c_02[1] = extraout_RDX_03;
                c_02[0] = size;
                parasail_memset___m128i(b_00,c_02,len);
                c_03[1] = extraout_RDX_04;
                c_03[0] = size;
                parasail_memset___m128i(b_01,c_03,len);
                c_04[1] = extraout_RDX_05;
                c_04[0] = size;
                parasail_memset___m128i(b_02,c_04,len);
                iVar65 = -open;
                iVar72 = -open;
                iVar74 = -open;
                iVar78 = -open;
                uVar31 = iVar39 - 1;
                alVar51 = (__m128i)pmovsxbd(extraout_XMM0,0x1010101);
                for (uVar33 = uVar31; -1 < (int)uVar33; uVar33 = uVar33 - 1) {
                  palVar36 = ptr_04 + uVar33;
                  *(int *)*palVar36 = iVar65;
                  *(int *)((long)*palVar36 + 4) = iVar72;
                  *(int *)(*palVar36 + 1) = iVar74;
                  *(int *)((long)*palVar36 + 0xc) = iVar78;
                  ptr_05[uVar33] = alVar51;
                  iVar65 = iVar65 - gap;
                  iVar72 = iVar72 - gap;
                  iVar74 = iVar74 - gap;
                  iVar78 = iVar78 - gap;
                  alVar52[0]._0_4_ = (int)alVar51[0] + 1;
                  alVar52[0]._4_4_ = alVar51[0]._4_4_ + 1;
                  alVar52[1]._0_4_ = (int)alVar51[1] + 1;
                  alVar52[1]._4_4_ = alVar51[1]._4_4_ + 1;
                  alVar51 = alVar52;
                }
                iVar65 = iVar45;
                for (uVar35 = 0; uVar35 != size; uVar35 = uVar35 + 1) {
                  iVar72 = iVar65;
                  for (lVar42 = 0; lVar42 != 4; lVar42 = lVar42 + 1) {
                    *(int *)((long)&h + lVar42 * 4) = iVar72;
                    iVar72 = iVar72 - iVar39 * gap;
                  }
                  ptr[uVar35][0] = h.m[0];
                  ptr[uVar35][1] = h.m[1];
                  iVar65 = iVar65 - gap;
                }
                *ptr_06 = 0;
                for (uVar35 = 1; uVar40 != uVar35; uVar35 = uVar35 + 1) {
                  ptr_06[uVar35] = iVar45;
                  iVar45 = iVar45 - gap;
                }
                palVar36 = ptr + uVar31;
                uVar40 = 0;
                local_158 = uVar27;
                uStack_154 = uVar27;
                uStack_150 = uVar27;
                uStack_14c = uVar27;
                local_148 = uVar29;
                uStack_144 = uVar29;
                uStack_140 = uVar29;
                uStack_13c = uVar29;
                while (uVar35 = uVar40, uVar35 != (uint)s2Len) {
                  uVar40 = b_03[uVar31][0];
                  uVar46 = b_04[uVar31][0];
                  uVar22 = b_05[uVar31][0];
                  auVar89._0_8_ = uVar40 << 0x20;
                  auVar89._8_8_ = b_03[uVar31][1] << 0x20 | uVar40 >> 0x20;
                  auVar93._0_8_ = uVar46 << 0x20;
                  auVar93._8_8_ = b_04[uVar31][1] << 0x20 | uVar46 >> 0x20;
                  auVar95._0_8_ = uVar22 << 0x20;
                  auVar95._8_8_ = b_05[uVar31][1] << 0x20 | uVar22 >> 0x20;
                  lVar42 = (long)(ppVar4->mapper[(byte)s2[uVar35]] * iVar39) * 0x10;
                  uVar97 = uVar29 - (int)(*ptr_04)[0];
                  uVar99 = uVar29 - *(int *)((long)*ptr_04 + 4);
                  uVar101 = uVar29 - (int)(*ptr_04)[1];
                  uVar103 = uVar29 - *(int *)((long)*ptr_04 + 0xc);
                  local_248 = ZEXT816(0);
                  lVar41 = 0;
                  local_268 = ZEXT816(0);
                  local_258 = ZEXT816(0);
                  uVar33 = uVar29;
                  uVar83 = uVar29;
                  uVar84 = uVar29;
                  uVar86 = uVar29;
                  iVar43 = ptr_06[uVar35];
                  iVar65 = (int)(*palVar36)[0];
                  iVar45 = *(int *)((long)*palVar36 + 4);
                  iVar72 = (int)(*palVar36)[1];
                  while( true ) {
                    uVar24 = local_1f8._0_4_;
                    uVar25 = local_1f8._4_4_;
                    uVar26 = local_1f8._8_4_;
                    if (size << 4 == lVar41) break;
                    piVar1 = (int *)((long)*ptr + lVar41);
                    iVar74 = *piVar1;
                    iVar78 = piVar1[1];
                    iVar79 = piVar1[2];
                    iVar75 = piVar1[3];
                    auVar50 = *(undefined1 (*) [16])((long)*b_03 + lVar41);
                    auVar60 = *(undefined1 (*) [16])((long)*b_04 + lVar41);
                    piVar1 = (int *)((long)*b + lVar41);
                    iVar105 = iVar74 - open;
                    iVar107 = iVar78 - open;
                    iVar108 = iVar79 - open;
                    iVar109 = iVar75 - open;
                    iVar110 = *piVar1 - gap;
                    iVar111 = piVar1[1] - gap;
                    iVar112 = piVar1[2] - gap;
                    iVar113 = piVar1[3] - gap;
                    auVar53._0_4_ = -(uint)(iVar110 < iVar105);
                    auVar53._4_4_ = -(uint)(iVar111 < iVar107);
                    auVar53._8_4_ = -(uint)(iVar112 < iVar108);
                    auVar53._12_4_ = -(uint)(iVar113 < iVar109);
                    auVar114 = blendvps(*(undefined1 (*) [16])((long)*b_00 + lVar41),auVar50,auVar53
                                       );
                    auVar61 = blendvps(*(undefined1 (*) [16])((long)*b_01 + lVar41),auVar60,auVar53)
                    ;
                    auVar87 = *(undefined1 (*) [16])((long)*b_05 + lVar41);
                    auVar67 = blendvps(*(undefined1 (*) [16])((long)*b_02 + lVar41),auVar87,auVar53)
                    ;
                    piVar1 = (int *)((long)*ptr_04 + lVar41);
                    iVar98 = uVar97 + *piVar1;
                    iVar100 = uVar99 + piVar1[1];
                    iVar102 = uVar101 + piVar1[2];
                    iVar104 = uVar103 + piVar1[3];
                    auVar54._0_4_ = -(uint)((int)uVar33 < iVar98);
                    auVar54._4_4_ = -(uint)((int)uVar83 < iVar100);
                    auVar54._8_4_ = -(uint)((int)uVar84 < iVar102);
                    auVar54._12_4_ = -(uint)((int)uVar86 < iVar104);
                    local_248 = blendvps(local_248,local_1d8,auVar54);
                    local_268 = blendvps(local_268,local_1e8,auVar54);
                    uVar97 = (uint)(iVar110 < iVar105) * iVar105 |
                             (uint)(iVar110 >= iVar105) * iVar110;
                    uVar99 = (uint)(iVar111 < iVar107) * iVar107 |
                             (uint)(iVar111 >= iVar107) * iVar111;
                    uVar101 = (uint)(iVar112 < iVar108) * iVar108 |
                              (uint)(iVar112 >= iVar108) * iVar112;
                    uVar103 = (uint)(iVar113 < iVar109) * iVar109 |
                              (uint)(iVar113 >= iVar109) * iVar113;
                    piVar1 = (int *)((long)*ptr_05 + lVar41);
                    auVar106._0_4_ = local_1f8._0_4_ + *piVar1;
                    auVar106._4_4_ = local_1f8._4_4_ + piVar1[1];
                    auVar106._8_4_ = local_1f8._8_4_ + piVar1[2];
                    auVar106._12_4_ = local_1f8._12_4_ + piVar1[3];
                    local_258 = blendvps(local_258,auVar106,auVar54);
                    piVar1 = (int *)((long)pvVar3 + lVar41 + lVar42);
                    iVar105 = iVar43 + *piVar1;
                    iVar65 = iVar65 + piVar1[1];
                    iVar45 = iVar45 + piVar1[2];
                    iVar72 = iVar72 + piVar1[3];
                    piVar1 = (int *)((long)pvVar5 + lVar41 + lVar42);
                    auVar90._0_4_ = auVar89._0_4_ + *piVar1;
                    auVar90._4_4_ = auVar89._4_4_ + piVar1[1];
                    auVar90._8_4_ = auVar89._8_4_ + piVar1[2];
                    auVar90._12_4_ = auVar89._12_4_ + piVar1[3];
                    piVar1 = (int *)((long)pvVar6 + lVar41 + lVar42);
                    auVar94._0_4_ = auVar93._0_4_ + *piVar1;
                    auVar94._4_4_ = auVar93._4_4_ + piVar1[1];
                    auVar94._8_4_ = auVar93._8_4_ + piVar1[2];
                    auVar94._12_4_ = auVar93._12_4_ + piVar1[3];
                    auVar55._0_4_ = -(uint)(iVar105 < (int)uVar97);
                    auVar55._4_4_ = -(uint)(iVar65 < (int)uVar99);
                    auVar55._8_4_ = -(uint)(iVar45 < (int)uVar101);
                    auVar55._12_4_ = -(uint)(iVar72 < (int)uVar103);
                    local_1d8 = blendvps(auVar90,auVar114,auVar55);
                    local_1e8 = blendvps(auVar94,auVar61,auVar55);
                    auVar68._0_4_ = auVar67._0_4_ + 1;
                    auVar68._4_4_ = auVar67._4_4_ + 1;
                    auVar68._8_4_ = auVar67._8_4_ + 1;
                    auVar68._12_4_ = auVar67._12_4_ + 1;
                    auVar96._0_4_ = auVar95._0_4_ + 1;
                    auVar96._4_4_ = auVar95._4_4_ + 1;
                    auVar96._8_4_ = auVar95._8_4_ + 1;
                    auVar96._12_4_ = auVar95._12_4_ + 1;
                    local_1f8 = blendvps(auVar96,auVar68,auVar55);
                    uVar33 = (uint)((int)uVar33 < iVar98) * iVar98 |
                             ((int)uVar33 >= iVar98) * uVar33;
                    uVar83 = (uint)((int)uVar83 < iVar100) * iVar100 |
                             ((int)uVar83 >= iVar100) * uVar83;
                    uVar84 = (uint)((int)uVar84 < iVar102) * iVar102 |
                             ((int)uVar84 >= iVar102) * uVar84;
                    uVar86 = (uint)((int)uVar86 < iVar104) * iVar104 |
                             ((int)uVar86 >= iVar104) * uVar86;
                    puVar2 = (uint *)((long)*b + lVar41);
                    *puVar2 = uVar97;
                    puVar2[1] = uVar99;
                    puVar2[2] = uVar101;
                    puVar2[3] = uVar103;
                    *(undefined1 (*) [16])((long)*b_00 + lVar41) = auVar114;
                    *(undefined1 (*) [16])((long)*b_01 + lVar41) = auVar61;
                    *(undefined1 (*) [16])((long)*b_02 + lVar41) = auVar68;
                    uVar97 = (uint)((int)uVar97 < iVar105) * iVar105 |
                             ((int)uVar97 >= iVar105) * uVar97;
                    uVar99 = (uint)((int)uVar99 < iVar65) * iVar65 |
                             ((int)uVar99 >= iVar65) * uVar99;
                    uVar101 = (uint)((int)uVar101 < iVar45) * iVar45 |
                              ((int)uVar101 >= iVar45) * uVar101;
                    uVar103 = (uint)((int)uVar103 < iVar72) * iVar72 |
                              ((int)uVar103 >= iVar72) * uVar103;
                    piVar1 = (int *)((long)*ptr + lVar41);
                    *piVar1 = iVar105;
                    piVar1[1] = iVar65;
                    piVar1[2] = iVar45;
                    piVar1[3] = iVar72;
                    *(undefined1 (*) [16])((long)*b_03 + lVar41) = auVar90;
                    *(undefined1 (*) [16])((long)*b_04 + lVar41) = auVar94;
                    *(undefined1 (*) [16])((long)*b_05 + lVar41) = auVar96;
                    lVar41 = lVar41 + 0x10;
                    auVar89 = auVar50;
                    auVar93 = auVar60;
                    auVar95 = auVar87;
                    iVar43 = iVar74;
                    iVar65 = iVar78;
                    iVar45 = iVar79;
                    iVar72 = iVar75;
                  }
                  auVar62._0_8_ = local_1d8._0_8_ << 0x20;
                  auVar62._8_8_ = local_1d8._8_8_ << 0x20 | (ulong)local_1d8._0_8_ >> 0x20;
                  auVar69._0_8_ = local_1e8._0_8_ << 0x20;
                  auVar69._8_8_ = local_1e8._8_8_ << 0x20 | (ulong)local_1e8._0_8_ >> 0x20;
                  iVar65 = ptr_06[uVar35 + 1];
                  iVar45 = (int)(*ptr_04)[0] + iVar65;
                  iVar72 = *(int *)((long)*ptr_04 + 4) + uVar97;
                  iVar74 = (int)(*ptr_04)[1] + uVar99;
                  iVar78 = *(int *)((long)*ptr_04 + 0xc) + uVar101;
                  auVar114._0_4_ = -(uint)(iVar45 < (int)uVar33);
                  auVar114._4_4_ = -(uint)(iVar72 < (int)uVar83);
                  auVar114._8_4_ = -(uint)(iVar74 < (int)uVar84);
                  auVar114._12_4_ = -(uint)(iVar78 < (int)uVar86);
                  auVar91._0_4_ =
                       (iVar45 < (int)uVar33) * uVar33 | (uint)(iVar45 >= (int)uVar33) * iVar45;
                  auVar91._4_4_ =
                       (iVar72 < (int)uVar83) * uVar83 | (uint)(iVar72 >= (int)uVar83) * iVar72;
                  auVar91._8_4_ =
                       (iVar74 < (int)uVar84) * uVar84 | (uint)(iVar74 >= (int)uVar84) * iVar74;
                  auVar91._12_4_ =
                       (iVar78 < (int)uVar86) * uVar86 | (uint)(iVar78 >= (int)uVar86) * iVar78;
                  auVar50 = blendvps(auVar62,local_248,auVar114);
                  auVar87 = blendvps(auVar69,local_268,auVar114);
                  auVar67._12_4_ = 0;
                  auVar67._0_12_ = local_1f8._0_12_;
                  local_1f8 = auVar67 << 0x20;
                  auVar81._4_4_ = *(int *)((long)*ptr_05 + 4) + uVar24;
                  auVar81._0_4_ = (int)(*ptr_05)[0];
                  auVar81._8_4_ = (int)(*ptr_05)[1] + uVar25;
                  auVar81._12_4_ = *(int *)((long)*ptr_05 + 0xc) + uVar26;
                  auVar60 = blendvps(auVar81,local_258,auVar114);
                  iVar45 = 2;
                  while( true ) {
                    local_98._0_8_ = auVar50._0_8_ << 0x20;
                    local_98._8_8_ = auVar50._8_8_ << 0x20 | auVar50._0_8_ >> 0x20;
                    local_a8._0_8_ = auVar87._0_8_ << 0x20;
                    local_a8._8_8_ = auVar87._8_8_ << 0x20 | auVar87._0_8_ >> 0x20;
                    local_b8._0_8_ = auVar60._0_8_ << 0x20;
                    local_b8._8_8_ = auVar60._8_8_ << 0x20 | auVar60._0_8_ >> 0x20;
                    bVar47 = iVar45 == 0;
                    iVar45 = iVar45 + -1;
                    uVar33 = auVar91._0_4_;
                    uVar83 = auVar91._4_4_;
                    uVar84 = auVar91._8_4_;
                    if (bVar47) break;
                    iVar74 = uVar33 + iVar30;
                    iVar78 = uVar83 + iVar30;
                    iVar79 = uVar84 + iVar30;
                    auVar56._0_4_ = -(uint)((int)uVar29 < (int)uVar33);
                    auVar56._4_4_ = -(uint)(iVar74 < (int)uVar83);
                    iVar72 = auVar91._12_4_;
                    auVar56._8_4_ = -(uint)(iVar78 < (int)uVar84);
                    auVar56._12_4_ = -(uint)(iVar79 < iVar72);
                    auVar50 = blendvps(local_98,auVar50,auVar56);
                    auVar87 = blendvps(local_a8,auVar87,auVar56);
                    auVar23._4_4_ = auVar60._4_4_ + iVar39;
                    auVar23._0_4_ = auVar60._0_4_ + iVar39;
                    auVar23._8_4_ = auVar60._8_4_ + iVar39;
                    auVar23._12_4_ = 0;
                    auVar60 = blendvps(auVar23 << 0x20,auVar60,auVar56);
                    auVar91._0_4_ =
                         ((int)uVar33 < (int)uVar29) * uVar29 |
                         ((int)uVar33 >= (int)uVar29) * uVar33;
                    auVar91._4_4_ =
                         (uint)((int)uVar83 < iVar74) * iVar74 | ((int)uVar83 >= iVar74) * uVar83;
                    auVar91._8_4_ =
                         (uint)((int)uVar84 < iVar78) * iVar78 | ((int)uVar84 >= iVar78) * uVar84;
                    auVar91._12_4_ =
                         (uint)(iVar72 < iVar79) * iVar79 | (uint)(iVar72 >= iVar79) * iVar72;
                  }
                  auVar57._0_4_ = -(uint)(iVar65 < (int)uVar29);
                  auVar57._4_4_ = -(uint)((int)uVar97 < (int)uVar33);
                  auVar57._8_4_ = -(uint)((int)uVar99 < (int)uVar83);
                  auVar57._12_4_ = -(uint)((int)uVar101 < (int)uVar84);
                  local_178 = (iVar65 < (int)uVar29) * uVar29 |
                              (uint)(iVar65 >= (int)uVar29) * iVar65;
                  uStack_174 = ((int)uVar97 < (int)uVar33) * uVar33 |
                               ((int)uVar97 >= (int)uVar33) * uVar97;
                  uStack_170 = ((int)uVar99 < (int)uVar83) * uVar83 |
                               ((int)uVar99 >= (int)uVar83) * uVar99;
                  uStack_16c = ((int)uVar101 < (int)uVar84) * uVar84 |
                               ((int)uVar101 >= (int)uVar84) * uVar101;
                  local_248 = blendvps(auVar62,local_98,auVar57);
                  local_258 = blendvps(auVar69,local_a8,auVar57);
                  local_268 = blendvps(local_1f8,local_b8,auVar57);
                  lVar42 = 0;
                  uVar86 = uVar29;
                  for (uVar46 = 0; uVar40 = uVar35 + 1, local_1e8 = auVar69, local_1d8 = auVar62,
                      size != uVar46; uVar46 = uVar46 + 1) {
                    iVar65 = local_178 - open;
                    iVar45 = uStack_174 - open;
                    iVar72 = uStack_170 - open;
                    iVar74 = uStack_16c - open;
                    iVar78 = uVar86 - gap;
                    iVar79 = uVar33 - gap;
                    iVar75 = uVar83 - gap;
                    iVar105 = uVar84 - gap;
                    auVar58._0_4_ = -(uint)(iVar78 < iVar65);
                    auVar58._4_4_ = -(uint)(iVar79 < iVar45);
                    auVar58._8_4_ = -(uint)(iVar75 < iVar72);
                    auVar58._12_4_ = -(uint)(iVar105 < iVar74);
                    local_98 = blendvps(local_98,local_248,auVar58);
                    puVar2 = (uint *)((long)*ptr + lVar42);
                    uVar97 = *puVar2;
                    uVar99 = puVar2[1];
                    uVar101 = puVar2[2];
                    uVar103 = puVar2[3];
                    local_a8 = blendvps(local_a8,local_258,auVar58);
                    uVar86 = (uint)(iVar65 < iVar78) * iVar78 | (uint)(iVar65 >= iVar78) * iVar65;
                    uVar33 = (uint)(iVar45 < iVar79) * iVar79 | (uint)(iVar45 >= iVar79) * iVar45;
                    uVar83 = (uint)(iVar72 < iVar75) * iVar75 | (uint)(iVar72 >= iVar75) * iVar72;
                    uVar84 = (uint)(iVar74 < iVar105) * iVar105 | (uint)(iVar74 >= iVar105) * iVar74
                    ;
                    auVar60 = blendvps(local_b8,local_268,auVar58);
                    piVar1 = (int *)((long)*b + lVar42);
                    iVar65 = *piVar1;
                    iVar45 = piVar1[1];
                    iVar72 = piVar1[2];
                    iVar74 = piVar1[3];
                    uVar66 = (iVar65 < (int)uVar97) * uVar97 |
                             (uint)(iVar65 >= (int)uVar97) * iVar65;
                    uVar73 = (iVar45 < (int)uVar99) * uVar99 |
                             (uint)(iVar45 >= (int)uVar99) * iVar45;
                    uVar76 = (iVar72 < (int)uVar101) * uVar101 |
                             (uint)(iVar72 >= (int)uVar101) * iVar72;
                    uVar80 = (iVar74 < (int)uVar103) * uVar103 |
                             (uint)(iVar74 >= (int)uVar103) * iVar74;
                    local_178 = ((int)uVar66 < (int)uVar86) * uVar86 |
                                ((int)uVar66 >= (int)uVar86) * uVar66;
                    uStack_174 = ((int)uVar73 < (int)uVar33) * uVar33 |
                                 ((int)uVar73 >= (int)uVar33) * uVar73;
                    uStack_170 = ((int)uVar76 < (int)uVar83) * uVar83 |
                                 ((int)uVar76 >= (int)uVar83) * uVar76;
                    uStack_16c = ((int)uVar80 < (int)uVar84) * uVar84 |
                                 ((int)uVar80 >= (int)uVar84) * uVar80;
                    auVar63._0_4_ = -(uint)(uVar97 == local_178);
                    auVar63._4_4_ = -(uint)(uVar99 == uStack_174);
                    auVar63._8_4_ = -(uint)(uVar101 == uStack_170);
                    auVar63._12_4_ = -(uint)(uVar103 == uStack_16c);
                    auVar70._0_4_ = -(uint)((int)uVar86 < (int)uVar66);
                    auVar70._4_4_ = -(uint)((int)uVar33 < (int)uVar73);
                    auVar70._8_4_ = -(uint)((int)uVar83 < (int)uVar76);
                    auVar70._12_4_ = -(uint)((int)uVar84 < (int)uVar80);
                    auVar50 = blendvps(local_98,*(undefined1 (*) [16])((long)*b_00 + lVar42),auVar70
                                      );
                    local_248 = blendvps(auVar50,*(undefined1 (*) [16])((long)*b_03 + lVar42),
                                         auVar63);
                    auVar50 = blendvps(local_a8,*(undefined1 (*) [16])((long)*b_01 + lVar42),auVar70
                                      );
                    local_258 = blendvps(auVar50,*(undefined1 (*) [16])((long)*b_04 + lVar42),
                                         auVar63);
                    local_b8._0_4_ = auVar60._0_4_ + 1;
                    local_b8._4_4_ = auVar60._4_4_ + 1;
                    local_b8._8_4_ = auVar60._8_4_ + 1;
                    local_b8._12_4_ = auVar60._12_4_ + 1;
                    auVar50 = blendvps(local_b8,*(undefined1 (*) [16])((long)*b_02 + lVar42),auVar70
                                      );
                    local_268 = blendvps(auVar50,*(undefined1 (*) [16])((long)*b_05 + lVar42),
                                         auVar63);
                    puVar2 = (uint *)((long)*ptr + lVar42);
                    *puVar2 = local_178;
                    puVar2[1] = uStack_174;
                    puVar2[2] = uStack_170;
                    puVar2[3] = uStack_16c;
                    *(undefined1 (*) [16])((long)*b_03 + lVar42) = local_248;
                    *(undefined1 (*) [16])((long)*b_04 + lVar42) = local_258;
                    *(undefined1 (*) [16])((long)*b_05 + lVar42) = local_268;
                    local_158 = ((int)local_178 < (int)local_158) * local_178 |
                                ((int)local_178 >= (int)local_158) * local_158;
                    uStack_154 = ((int)uStack_174 < (int)uStack_154) * uStack_174 |
                                 ((int)uStack_174 >= (int)uStack_154) * uStack_154;
                    uStack_150 = ((int)uStack_170 < (int)uStack_150) * uStack_170 |
                                 ((int)uStack_170 >= (int)uStack_150) * uStack_150;
                    uStack_14c = ((int)uStack_16c < (int)uStack_14c) * uStack_16c |
                                 ((int)uStack_16c >= (int)uStack_14c) * uStack_14c;
                    uVar97 = ((int)local_148 < (int)local_178) * local_178 |
                             ((int)local_148 >= (int)local_178) * local_148;
                    uVar99 = ((int)uStack_144 < (int)uStack_174) * uStack_174 |
                             ((int)uStack_144 >= (int)uStack_174) * uStack_144;
                    uVar101 = ((int)uStack_140 < (int)uStack_170) * uStack_170 |
                              ((int)uStack_140 >= (int)uStack_170) * uStack_140;
                    uVar103 = ((int)uStack_13c < (int)uStack_16c) * uStack_16c |
                              ((int)uStack_13c >= (int)uStack_16c) * uStack_13c;
                    iVar65 = local_248._0_4_;
                    uVar66 = (uint)((int)uVar97 < iVar65) * iVar65 |
                             ((int)uVar97 >= iVar65) * uVar97;
                    iVar65 = local_248._4_4_;
                    uVar73 = (uint)((int)uVar99 < iVar65) * iVar65 |
                             ((int)uVar99 >= iVar65) * uVar99;
                    iVar65 = local_248._8_4_;
                    uVar76 = (uint)((int)uVar101 < iVar65) * iVar65 |
                             ((int)uVar101 >= iVar65) * uVar101;
                    iVar65 = local_248._12_4_;
                    uVar80 = (uint)((int)uVar103 < iVar65) * iVar65 |
                             ((int)uVar103 >= iVar65) * uVar103;
                    iVar65 = local_268._0_4_;
                    iVar45 = local_258._0_4_;
                    uVar97 = (uint)(iVar45 < iVar65) * iVar65 | (uint)(iVar45 >= iVar65) * iVar45;
                    iVar65 = local_268._4_4_;
                    iVar45 = local_258._4_4_;
                    uVar99 = (uint)(iVar45 < iVar65) * iVar65 | (uint)(iVar45 >= iVar65) * iVar45;
                    iVar65 = local_268._8_4_;
                    iVar45 = local_258._8_4_;
                    iVar72 = local_258._12_4_;
                    uVar101 = (uint)(iVar45 < iVar65) * iVar65 | (uint)(iVar45 >= iVar65) * iVar45;
                    iVar65 = local_268._12_4_;
                    uVar103 = (uint)(iVar72 < iVar65) * iVar65 | (uint)(iVar72 >= iVar65) * iVar72;
                    local_148 = ((int)uVar66 < (int)uVar97) * uVar97 |
                                ((int)uVar66 >= (int)uVar97) * uVar66;
                    uStack_144 = ((int)uVar73 < (int)uVar99) * uVar99 |
                                 ((int)uVar73 >= (int)uVar99) * uVar73;
                    uStack_140 = ((int)uVar76 < (int)uVar101) * uVar101 |
                                 ((int)uVar76 >= (int)uVar101) * uVar76;
                    uStack_13c = ((int)uVar80 < (int)uVar103) * uVar103 |
                                 ((int)uVar80 >= (int)uVar103) * uVar80;
                    vH[0] = uVar46 & 0xffffffff;
                    t = (int32_t)uVar35;
                    vH[1] = size;
                    palVar44 = b_04;
                    arr_store_si128(*((ppVar32->field_4).trace)->trace_del_table,vH,t,s2Len,
                                    (int32_t)b_04,(int32_t)ptr_06);
                    vH_00[0] = uVar46 & 0xffffffff;
                    vH_00[1] = size;
                    iVar43 = (int32_t)palVar44;
                    arr_store_si128(*(int **)((long)((ppVar32->field_4).trace)->trace_del_table + 8)
                                    ,vH_00,t,s2Len,iVar43,(int32_t)ptr_06);
                    vH_01[0] = uVar46 & 0xffffffff;
                    vH_01[1] = size;
                    arr_store_si128(*(int **)((long)((ppVar32->field_4).trace)->trace_del_table +
                                             0x10),vH_01,t,s2Len,iVar43,(int32_t)ptr_06);
                    vH_02[0] = uVar46 & 0xffffffff;
                    vH_02[1] = size;
                    arr_store_si128(*(int **)((long)((ppVar32->field_4).trace)->trace_del_table +
                                             0x18),vH_02,t,s2Len,iVar43,(int32_t)ptr_06);
                    lVar42 = lVar42 + 0x10;
                  }
                }
                alVar59 = ptr[uVar49];
                alVar64 = b_03[uVar49];
                alVar71 = b_04[uVar49];
                alVar82 = b_05[uVar49];
                iVar65 = 0;
                while( true ) {
                  uVar49 = alVar59[0];
                  lVar42 = alVar59[1];
                  uVar40 = alVar64[0];
                  lVar41 = alVar64[1];
                  uVar35 = alVar71[0];
                  lVar77 = alVar71[1];
                  uVar46 = alVar82[0];
                  lVar85 = alVar82[1];
                  if (3 - (int)(uVar38 / size) <= iVar65) break;
                  alVar59[0] = uVar49 << 0x20;
                  alVar59[1] = lVar42 << 0x20 | uVar49 >> 0x20;
                  alVar64[0] = uVar40 << 0x20;
                  alVar64[1] = lVar41 << 0x20 | uVar40 >> 0x20;
                  alVar71[0] = uVar35 << 0x20;
                  alVar71[1] = lVar77 << 0x20 | uVar35 >> 0x20;
                  alVar82[0] = uVar46 << 0x20;
                  alVar82[1] = lVar85 << 0x20 | uVar46 >> 0x20;
                  iVar65 = iVar65 + 1;
                }
                auVar88._0_4_ = -(uint)((int)local_158 < (int)uVar29);
                auVar88._4_4_ = -(uint)((int)uStack_154 < (int)uVar29);
                auVar88._8_4_ = -(uint)((int)uStack_150 < (int)uVar29);
                auVar88._12_4_ = -(uint)((int)uStack_14c < (int)uVar29);
                auVar92._0_4_ = -(uint)((int)uVar27 < (int)local_148);
                auVar92._4_4_ = -(uint)((int)uVar27 < (int)uStack_144);
                auVar92._8_4_ = -(uint)((int)uVar27 < (int)uStack_140);
                auVar92._12_4_ = -(uint)((int)uVar27 < (int)uStack_13c);
                iVar65 = movmskps(iVar65,auVar92 | auVar88);
                if (iVar65 == 0) {
                  iVar65 = alVar59[1]._4_4_;
                  iVar45 = alVar64[1]._4_4_;
                  iVar72 = alVar71[1]._4_4_;
                  iVar74 = alVar82[1]._4_4_;
                }
                else {
                  *(byte *)&ppVar32->flag = (byte)ppVar32->flag | 0x40;
                  iVar65 = 0;
                  iVar45 = 0;
                  iVar72 = 0;
                  iVar74 = 0;
                  iVar28 = 0;
                  uVar38 = 0;
                }
                ppVar32->score = iVar65;
                ppVar32->end_query = uVar38;
                ppVar32->end_ref = iVar28;
                ((ppVar32->field_4).stats)->matches = iVar45;
                ((ppVar32->field_4).stats)->similar = iVar72;
                ((ppVar32->field_4).stats)->length = iVar74;
                parasail_free(ptr_06);
                parasail_free(ptr_05);
                parasail_free(ptr_04);
                parasail_free(ptr_03);
                parasail_free(ptr_02);
                parasail_free(ptr_01);
                parasail_free(ptr_00);
                parasail_free(b_05);
                parasail_free(b_04);
                parasail_free(b_03);
                parasail_free(ptr);
                parasail_free(b_02);
                parasail_free(b_01);
                parasail_free(b_00);
                parasail_free(b);
                return ppVar32;
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar37 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_nw_stats_table_scan_profile_sse41_128_32",pcVar37);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvPm = NULL;
    __m128i* restrict pvPs = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHM = NULL;
    __m128i* restrict pvHS = NULL;
    __m128i* restrict pvHL = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvHMMax = NULL;
    __m128i* restrict pvHSMax = NULL;
    __m128i* restrict pvHLMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i* restrict pvGapperL = NULL;
    int32_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int32_t score = 0;
    int32_t matches = 0;
    int32_t similar = 0;
    int32_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    __m128i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m128i*)profile->profile32.score;
    pvPm = (__m128i*)profile->profile32.matches;
    pvPs = (__m128i*)profile->profile32.similar;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi32(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vSegLen = _mm_slli_si128(_mm_set1_epi32(segLen), 4);
    vNegInfFront = _mm_insert_epi32(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_add_epi32(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi32(-segLen*gap), 4));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m128i(16, segLen);
    pvEM = parasail_memalign___m128i(16, segLen);
    pvES = parasail_memalign___m128i(16, segLen);
    pvEL = parasail_memalign___m128i(16, segLen);
    pvH  = parasail_memalign___m128i(16, segLen);
    pvHM = parasail_memalign___m128i(16, segLen);
    pvHS = parasail_memalign___m128i(16, segLen);
    pvHL = parasail_memalign___m128i(16, segLen);
    pvHMax  = parasail_memalign___m128i(16, segLen);
    pvHMMax = parasail_memalign___m128i(16, segLen);
    pvHSMax = parasail_memalign___m128i(16, segLen);
    pvHLMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);
    pvGapperL = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int32_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHM, vZero, segLen);
    parasail_memset___m128i(pvHS, vZero, segLen);
    parasail_memset___m128i(pvHL, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vZero, segLen);
    {
        __m128i vGapper = _mm_sub_epi32(vZero,vGapO);
        __m128i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            _mm_store_si128(pvGapperL+i, vGapperL);
            vGapper = _mm_sub_epi32(vGapper, vGapE);
            vGapperL = _mm_add_epi32(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_32_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vE_ext;
        __m128i vE_opn;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vHt;
        __m128i vHtM;
        __m128i vHtS;
        __m128i vHtL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vF_opn;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        __m128i vHp;
        __m128i vHpM;
        __m128i vHpS;
        __m128i vHpL;
        __m128i *pvW;
        __m128i vW;
        __m128i *pvWM;
        __m128i vWM;
        __m128i *pvWS;
        __m128i vWS;
        __m128i case1;
        __m128i case2;
        __m128i vGapper;
        __m128i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHpM = _mm_load_si128(pvHM+(segLen-1));
        vHpS = _mm_load_si128(pvHS+(segLen-1));
        vHpL = _mm_load_si128(pvHL+(segLen-1));
        vHp = _mm_slli_si128(vHp, 4);
        vHpM = _mm_slli_si128(vHpM, 4);
        vHpS = _mm_slli_si128(vHpS, 4);
        vHpL = _mm_slli_si128(vHpL, 4);
        vHp = _mm_insert_epi32(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_sub_epi32(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vHM= _mm_load_si128(pvHM+i);
            vHS= _mm_load_si128(pvHS+i);
            vHL= _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM= _mm_load_si128(pvEM+i);
            vES= _mm_load_si128(pvES+i);
            vEL= _mm_load_si128(pvEL+i);
            vW = _mm_load_si128(pvW+i);
            vWM = _mm_load_si128(pvWM+i);
            vWS = _mm_load_si128(pvWS+i);
            vGapper = _mm_load_si128(pvGapper+i);
            vGapperL = _mm_load_si128(pvGapperL+i);
            vE_opn = _mm_sub_epi32(vH, vGapO);
            vE_ext = _mm_sub_epi32(vE, vGapE);
            case1 = _mm_cmpgt_epi32(vE_opn, vE_ext);
            vE = _mm_max_epi32(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(vEL, vHL, case1);
            vEL = _mm_add_epi32(vEL, vOne);
            vGapper = _mm_add_epi32(vHt, vGapper);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi32(vF, vGapper),
                    _mm_cmpeq_epi32(vF, vGapper));
            vF = _mm_max_epi32(vF, vGapper);
            vFM = _mm_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_add_epi32(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm_add_epi32(vHp, vW);
            vHpM = _mm_add_epi32(vHpM, vWM);
            vHpS = _mm_add_epi32(vHpS, vWS);
            vHpL = _mm_add_epi32(vHpL, vOne);
            case1 = _mm_cmpgt_epi32(vE, vHp);
            vHt = _mm_max_epi32(vE, vHp);
            vHtM = _mm_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm_blendv_epi8(vHpL, vEL, case1);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvEM+i, vEM);
            _mm_store_si128(pvES+i, vES);
            _mm_store_si128(pvEL+i, vEL);
            _mm_store_si128(pvH+i, vHp);
            _mm_store_si128(pvHM+i, vHpM);
            _mm_store_si128(pvHS+i, vHpS);
            _mm_store_si128(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 4);
        vHtM = _mm_slli_si128(vHtM, 4);
        vHtS = _mm_slli_si128(vHtS, 4);
        vHtL = _mm_slli_si128(vHtL, 4);
        vHt = _mm_insert_epi32(vHt, boundary[j+1], 0);
        vGapper = _mm_load_si128(pvGapper);
        vGapperL = _mm_load_si128(pvGapperL);
        vGapper = _mm_add_epi32(vHt, vGapper);
        case1 = _mm_or_si128(
                _mm_cmpgt_epi32(vGapper, vF),
                _mm_cmpeq_epi32(vGapper, vF));
        vF = _mm_max_epi32(vF, vGapper);
        vFM = _mm_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm_blendv_epi8(
                vFL,
                _mm_add_epi32(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 4);
            __m128i vFtM = _mm_slli_si128(vFM, 4);
            __m128i vFtS = _mm_slli_si128(vFS, 4);
            __m128i vFtL = _mm_slli_si128(vFL, 4);
            vFt = _mm_add_epi32(vFt, vSegLenXgap);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi32(vFt, vF),
                    _mm_cmpeq_epi32(vFt, vF));
            vF = _mm_max_epi32(vF, vFt);
            vFM = _mm_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm_blendv_epi8(
                    vFL,
                    _mm_add_epi32(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 4);
        vFM = _mm_slli_si128(vFM, 4);
        vFS = _mm_slli_si128(vFS, 4);
        vFL = _mm_slli_si128(vFL, 4);
        vF = _mm_add_epi32(vF, vNegInfFront);
        case1 = _mm_cmpgt_epi32(vF, vHt);
        vH = _mm_max_epi32(vF, vHt);
        vHM = _mm_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm_load_si128(pvH+i);
            vHpM = _mm_load_si128(pvHM+i);
            vHpS = _mm_load_si128(pvHS+i);
            vHpL = _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM = _mm_load_si128(pvEM+i);
            vES = _mm_load_si128(pvES+i);
            vEL = _mm_load_si128(pvEL+i);
            vF_opn = _mm_sub_epi32(vH, vGapO);
            vF_ext = _mm_sub_epi32(vF, vGapE);
            vF = _mm_max_epi32(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi32(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(vFL, vHL, case1);
            vFL = _mm_add_epi32(vFL, vOne);
            vH = _mm_max_epi32(vHp, vE);
            vH = _mm_max_epi32(vH, vF);
            case1 = _mm_cmpeq_epi32(vH, vHp);
            case2 = _mm_cmpeq_epi32(vH, vF);
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            _mm_store_si128(pvH+i, vH);
            _mm_store_si128(pvHM+i, vHM);
            _mm_store_si128(pvHS+i, vHS);
            _mm_store_si128(pvHL+i, vHL);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvH + offset);
            vHM = _mm_load_si128(pvHM + offset);
            vHS = _mm_load_si128(pvHS + offset);
            vHL = _mm_load_si128(pvHL + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
                vHM = _mm_slli_si128(vHM, 4);
                vHS = _mm_slli_si128(vHS, 4);
                vHL = _mm_slli_si128(vHL, 4);
            }
            result->stats->rowcols->score_row[j] = (int32_t) _mm_extract_epi32 (vH, 3);
            result->stats->rowcols->matches_row[j] = (int32_t) _mm_extract_epi32 (vHM, 3);
            result->stats->rowcols->similar_row[j] = (int32_t) _mm_extract_epi32 (vHS, 3);
            result->stats->rowcols->length_row[j] = (int32_t) _mm_extract_epi32 (vHL, 3);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        __m128i vHM = _mm_load_si128(pvHM+i);
        __m128i vHS = _mm_load_si128(pvHS+i);
        __m128i vHL = _mm_load_si128(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvH + offset);
        __m128i vHM = _mm_load_si128(pvHM + offset);
        __m128i vHS = _mm_load_si128(pvHS + offset);
        __m128i vHL = _mm_load_si128(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 4);
            vHM = _mm_slli_si128(vHM, 4);
            vHS = _mm_slli_si128(vHS, 4);
            vHL = _mm_slli_si128(vHL, 4);
        }
        score = (int32_t) _mm_extract_epi32 (vH, 3);
        matches = (int32_t) _mm_extract_epi32 (vHM, 3);
        similar = (int32_t) _mm_extract_epi32 (vHS, 3);
        length = (int32_t) _mm_extract_epi32 (vHL, 3);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}